

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtrule.cpp
# Opt level: O3

int __thiscall
icu_63::DateTimeRule::clone
          (DateTimeRule *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)UMemory::operator_new((UMemory *)0x28,(size_t)__fn);
  if (puVar2 != (undefined8 *)0x0) {
    *puVar2 = &PTR__DateTimeRule_003e2788;
    uVar1 = *(undefined8 *)&this->fDayOfWeek;
    puVar2[1] = *(undefined8 *)&this->fMonth;
    puVar2[2] = uVar1;
    puVar2[3] = *(undefined8 *)&this->fMillisInDay;
    *(TimeRuleType *)(puVar2 + 4) = this->fTimeRuleType;
  }
  return (int)puVar2;
}

Assistant:

DateTimeRule*
DateTimeRule::clone() const {
    return new DateTimeRule(*this);
}